

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userobject.cpp
# Opt level: O2

void __thiscall
camp::UserObject::UserObject(UserObject *this,UserObject *parent,UserProperty *member)

{
  Class *pCVar1;
  ParentObject *pPVar2;
  
  pCVar1 = UserProperty::getClass(member);
  this->m_class = pCVar1;
  (this->m_holder).
  super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_holder).
  super___shared_ptr<camp::detail::AbstractObjectHolder,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  pPVar2 = (ParentObject *)operator_new(0x58);
  ParentObject::ParentObject(pPVar2,parent,member);
  (this->m_parent).px = pPVar2;
  this->m_child = (UserObject *)0x0;
  pPVar2 = boost::scoped_ptr<camp::ParentObject>::operator->(&this->m_parent);
  (pPVar2->object).m_child = this;
  return;
}

Assistant:

UserObject::UserObject(const UserObject& parent, const UserProperty& member)
    : m_class(&member.getClass())
    , m_holder()
    , m_parent(new ParentObject(parent, member))
    , m_child(0)
{
    m_parent->object.m_child = this;
}